

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallTargetGenerator::GenerateScriptForConfig
          (cmInstallTargetGenerator *this,ostream *os,string *config,Indent indent)

{
  undefined1 uVar1;
  undefined8 uVar2;
  bool bVar3;
  ulong uVar4;
  char *permissions_file;
  char *literal_args_00;
  byte local_309;
  anon_class_8_1_8991fb9c local_2e0;
  TweakMethod local_2d8;
  Indent local_2b8;
  int local_2b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  string local_270 [8];
  string literal_args;
  bool optional;
  char *no_rename;
  char *no_dir_permissions;
  TweakMethod local_230;
  Indent local_20c;
  cmAlphaNum local_208;
  string local_1d8;
  cmAlphaNum local_1b8;
  undefined1 local_188 [8];
  string toDir;
  cmAlphaNum local_138;
  string local_108;
  undefined1 local_d8 [8];
  string dest;
  undefined1 local_b0 [8];
  Files files;
  string *config_local;
  ostream *os_local;
  cmInstallTargetGenerator *this_local;
  Indent indent_local;
  
  files._120_8_ = config;
  GetFiles((Files *)local_b0,this,config);
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_b0);
  if (bVar3) {
    dest.field_2._12_4_ = 1;
  }
  else {
    GetDestination((string *)local_d8,this,(string *)files._120_8_);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      cmAlphaNum::cmAlphaNum(&local_138,(string *)local_d8);
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&toDir.field_2 + 8),'/');
      cmStrCat<std::__cxx11::string>
                (&local_108,&local_138,(cmAlphaNum *)((long)&toDir.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&files.FromDir.field_2 + 8));
      std::__cxx11::string::operator=((string *)local_d8,(string *)&local_108);
      std::__cxx11::string::~string((string *)&local_108);
    }
    cmInstallGenerator::ConvertToAbsoluteDestination(&local_1d8,(string *)local_d8);
    cmAlphaNum::cmAlphaNum(&local_1b8,&local_1d8);
    cmAlphaNum::cmAlphaNum(&local_208,'/');
    cmStrCat<>((string *)local_188,&local_1b8,&local_208);
    std::__cxx11::string::~string((string *)&local_1d8);
    uVar2 = files._120_8_;
    if ((files.ToDir.field_2._M_local_buf[0xc] & 1U) == 0) {
      no_dir_permissions = (char *)this;
      local_20c.Level = indent.Level;
      std::
      function<void(std::ostream&,cmScriptGeneratorIndent,std::__cxx11::string_const&,std::__cxx11::string_const&)>
      ::
      function<cmInstallTargetGenerator::GenerateScriptForConfig(std::ostream&,std::__cxx11::string_const&,cmScriptGeneratorIndent)::__0,void>
                ((function<void(std::ostream&,cmScriptGeneratorIndent,std::__cxx11::string_const&,std::__cxx11::string_const&)>
                  *)&local_230,(anon_class_8_1_8991fb9c *)&no_dir_permissions);
      cmInstallGenerator::AddTweak
                (os,local_20c,(string *)uVar2,(string *)local_188,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&files.From.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_230);
      std::
      function<void_(std::basic_ostream<char,_std::char_traits<char>_>_&,_cmScriptGeneratorIndent,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::~function(&local_230);
    }
    local_309 = 1;
    if ((this->Optional & 1U) == 0) {
      local_309 = this->ImportLibrary;
    }
    literal_args.field_2._M_local_buf[0xf] = local_309 & 1;
    std::__cxx11::string::string(local_270);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::operator+(&local_2b0," FILES_FROM_DIR \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &files.To.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::operator+(&local_290,&local_2b0,"\"");
      std::__cxx11::string::operator+=(local_270,(string *)&local_290);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_2b0);
    }
    if ((files.ToDir.field_2._M_local_buf[0xd] & 1U) != 0) {
      std::__cxx11::string::operator+=(local_270," USE_SOURCE_PERMISSIONS");
    }
    uVar1 = literal_args.field_2._M_local_buf[0xf];
    permissions_file = (char *)std::__cxx11::string::c_str();
    literal_args_00 = (char *)std::__cxx11::string::c_str();
    local_2b4 = indent.Level;
    cmInstallGenerator::AddInstallRule
              (&this->super_cmInstallGenerator,os,(string *)local_d8,files.NamelinkMode,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_b0,(bool)(uVar1 & 1),permissions_file,(char *)0x0,(char *)0x0,
               literal_args_00,indent,(char *)0x0);
    uVar2 = files._120_8_;
    if ((files.ToDir.field_2._M_local_buf[0xc] & 1U) == 0) {
      local_2e0.this = this;
      local_2b8.Level = indent.Level;
      std::
      function<void(std::ostream&,cmScriptGeneratorIndent,std::__cxx11::string_const&,std::__cxx11::string_const&)>
      ::
      function<cmInstallTargetGenerator::GenerateScriptForConfig(std::ostream&,std::__cxx11::string_const&,cmScriptGeneratorIndent)::__1,void>
                ((function<void(std::ostream&,cmScriptGeneratorIndent,std::__cxx11::string_const&,std::__cxx11::string_const&)>
                  *)&local_2d8,&local_2e0);
      cmInstallGenerator::AddTweak
                (os,local_2b8,(string *)uVar2,(string *)local_188,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&files.From.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_2d8);
      std::
      function<void_(std::basic_ostream<char,_std::char_traits<char>_>_&,_cmScriptGeneratorIndent,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::~function(&local_2d8);
    }
    std::__cxx11::string::~string(local_270);
    std::__cxx11::string::~string((string *)local_188);
    std::__cxx11::string::~string((string *)local_d8);
    dest.field_2._12_4_ = 0;
  }
  Files::~Files((Files *)local_b0);
  return;
}

Assistant:

void cmInstallTargetGenerator::GenerateScriptForConfig(
  std::ostream& os, const std::string& config, Indent indent)
{
  // Compute the list of files to install for this target.
  Files files = this->GetFiles(config);

  // Skip this rule if no files are to be installed for the target.
  if (files.From.empty()) {
    return;
  }

  // Compute the effective install destination.
  std::string dest = this->GetDestination(config);
  if (!files.ToDir.empty()) {
    dest = cmStrCat(dest, '/', files.ToDir);
  }

  // Tweak files located in the destination directory.
  std::string toDir = cmStrCat(ConvertToAbsoluteDestination(dest), '/');

  // Add pre-installation tweaks.
  if (!files.NoTweak) {
    AddTweak(os, indent, config, toDir, files.To,
             [this](std::ostream& o, Indent i, const std::string& c,
                    const std::string& f) {
               this->PreReplacementTweaks(o, i, c, f);
             });
  }

  // Write code to install the target file.
  const char* no_dir_permissions = nullptr;
  const char* no_rename = nullptr;
  bool optional = this->Optional || this->ImportLibrary;
  std::string literal_args;
  if (!files.FromDir.empty()) {
    literal_args += " FILES_FROM_DIR \"" + files.FromDir + "\"";
  }
  if (files.UseSourcePermissions) {
    literal_args += " USE_SOURCE_PERMISSIONS";
  }
  this->AddInstallRule(os, dest, files.Type, files.From, optional,
                       this->FilePermissions.c_str(), no_dir_permissions,
                       no_rename, literal_args.c_str(), indent);

  // Add post-installation tweaks.
  if (!files.NoTweak) {
    AddTweak(os, indent, config, toDir, files.To,
             [this](std::ostream& o, Indent i, const std::string& c,
                    const std::string& f) {
               this->PostReplacementTweaks(o, i, c, f);
             });
  }
}